

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gepard-stroke-builder.cpp
# Opt level: O1

void __thiscall
gepard::StrokePathBuilder::LineAttributes::set
          (LineAttributes *this,FloatPoint *from,FloatPoint *to,Float halfWidth)

{
  Float FVar1;
  bool bVar2;
  FloatPoint local_30;
  
  FVar1 = from->y;
  (this->location).x = from->x;
  (this->location).y = FVar1;
  FloatPoint::FloatPoint(&local_30,to->x - from->x,to->y - from->y);
  (this->vector).x = local_30.x;
  (this->vector).y = local_30.y;
  bVar2 = FloatPoint::isZero(&this->vector);
  if (!bVar2) {
    FVar1 = FloatPoint::length(&this->vector);
    this->length = FVar1;
    if ((FVar1 == 0.0) && (!NAN(FVar1))) {
      __assert_fail("f",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/szledan[P]gepard/src/utils/gepard-float-point.h"
                    ,0x6c,"FloatPoint gepard::operator/(const FloatPoint &, const Float &)");
    }
    FloatPoint::FloatPoint(&local_30,(this->vector).x / FVar1,(this->vector).y / FVar1);
    (this->unit).x = local_30.x;
    (this->unit).y = local_30.y;
    (this->thicknessOffsets).x = local_30.x * halfWidth;
    (this->thicknessOffsets).y = local_30.y * halfWidth;
    FloatPoint::set(&this->startTop,local_30.y * halfWidth + from->x,
                    from->y - local_30.x * halfWidth);
    FloatPoint::set(&this->startBottom,from->x - (this->thicknessOffsets).y,
                    from->y + (this->thicknessOffsets).x);
    FloatPoint::set(&this->endBottom,to->x - (this->thicknessOffsets).y,
                    to->y + (this->thicknessOffsets).x);
    FloatPoint::set(&this->endTop,to->x + (this->thicknessOffsets).y,
                    to->y - (this->thicknessOffsets).x);
  }
  return;
}

Assistant:

void StrokePathBuilder::LineAttributes::set(const FloatPoint& from, const FloatPoint& to, const Float halfWidth)
{
    location = from;
    vector = to - from;

    if (vector.isZero())
        return;

    length = vector.length();
    unit = vector / length;

    thicknessOffsets.x = halfWidth * unit.x;
    thicknessOffsets.y = halfWidth * unit.y;

    startTop.set(from.x + thicknessOffsets.y, from.y - thicknessOffsets.x);
    startBottom.set(from.x - thicknessOffsets.y, from.y + thicknessOffsets.x);
    endBottom.set(to.x - thicknessOffsets.y, to.y + thicknessOffsets.x);
    endTop.set(to.x + thicknessOffsets.y, to.y - thicknessOffsets.x);
}